

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_appender.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true> __thiscall
duckdb::ArrowAppender::InitializeChild
          (ArrowAppender *this,LogicalType *type,idx_t capacity,ClientProperties *options,
          shared_ptr<duckdb::ArrowTypeExtensionData,_true> *extension_type)

{
  ArrowOffsetSize AVar1;
  initialize_t p_Var2;
  ArrowTypeExtensionData *this_00;
  type pAVar3;
  pointer pAVar4;
  ArrowBuffer *this_01;
  NotImplementedException *this_02;
  InternalException *pIVar5;
  code *pcVar6;
  allocator local_81;
  LogicalType array_type;
  string local_68;
  string local_48;
  
  make_uniq<duckdb::ArrowAppendData,duckdb::ClientProperties&>((duckdb *)this,options);
  LogicalType::LogicalType(&array_type,type);
  if ((extension_type->internal).
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->(extension_type);
    ArrowTypeExtensionData::GetInternalType((LogicalType *)&local_68,this_00);
    LogicalType::operator=(&array_type,(LogicalType *)&local_68);
    LogicalType::~LogicalType((LogicalType *)&local_68);
  }
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                      *)this);
  switch(array_type.id_) {
  case SQLNULL:
    pAVar3->initialize = ArrowNullData::Initialize;
    pAVar3->append_vector = ArrowNullData::Append;
    pcVar6 = ArrowNullData::Finalize;
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_008b788f_caseD_2:
    this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_68,"Unsupported type in DuckDB -> Arrow Conversion: %s\n",&local_81)
    ;
    LogicalType::ToString_abi_cxx11_(&local_48,&array_type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_02,&local_68,&local_48);
    __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    pAVar3->initialize = ArrowBoolData::Initialize;
    pAVar3->append_vector = ArrowBoolData::Append;
    pcVar6 = ArrowBoolData::Finalize;
    break;
  case TINYINT:
    pAVar3->initialize =
         ArrowScalarData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case SMALLINT:
    pAVar3->initialize = ArrowScalarData<short,_short,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector = ArrowScalarBaseData<short,_short,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<short,_short,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case INTEGER:
  case DATE:
    pAVar3->initialize = ArrowScalarData<int,_int,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector = ArrowScalarBaseData<int,_int,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<int,_int,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case DECIMAL:
    if (array_type.physical_type_ != INT128) {
      if (array_type.physical_type_ == INT32) {
        pAVar3->initialize =
             ArrowScalarData<duckdb::hugeint_t,_int,_duckdb::ArrowScalarConverter>::Initialize;
        pAVar3->append_vector =
             ArrowScalarBaseData<duckdb::hugeint_t,_int,_duckdb::ArrowScalarConverter>::Append;
        pcVar6 = ArrowScalarData<duckdb::hugeint_t,_int,_duckdb::ArrowScalarConverter>::Finalize;
      }
      else if (array_type.physical_type_ == INT64) {
        pAVar3->initialize =
             ArrowScalarData<duckdb::hugeint_t,_long,_duckdb::ArrowScalarConverter>::Initialize;
        pAVar3->append_vector =
             ArrowScalarBaseData<duckdb::hugeint_t,_long,_duckdb::ArrowScalarConverter>::Append;
        pcVar6 = ArrowScalarData<duckdb::hugeint_t,_long,_duckdb::ArrowScalarConverter>::Finalize;
      }
      else {
        if (array_type.physical_type_ != INT16) {
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_68,"Unsupported internal decimal type",(allocator *)&local_48)
          ;
          InternalException::InternalException(pIVar5,&local_68);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pAVar3->initialize =
             ArrowScalarData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Initialize;
        pAVar3->append_vector =
             ArrowScalarBaseData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Append;
        pcVar6 = ArrowScalarData<duckdb::hugeint_t,_short,_duckdb::ArrowScalarConverter>::Finalize;
      }
      break;
    }
  case HUGEINT:
    pAVar3->initialize =
         ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowScalarConverter>::
         Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowScalarConverter>::
         Append;
    pcVar6 = ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowScalarConverter>::
             Finalize;
    break;
  case FLOAT:
    pAVar3->initialize = ArrowScalarData<float,_float,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector = ArrowScalarBaseData<float,_float,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<float,_float,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case DOUBLE:
    pAVar3->initialize = ArrowScalarData<double,_double,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<double,_double,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<double,_double,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case VARCHAR:
    if ((pAVar3->options).produce_arrow_string_view == true) {
      pAVar3->initialize = ArrowVarcharToStringViewData::Initialize;
      pAVar3->append_vector = ArrowVarcharToStringViewData::Append;
      pcVar6 = ArrowVarcharToStringViewData::Finalize;
      break;
    }
  case BLOB:
  case BIT:
  case VARINT:
    if ((pAVar3->options).arrow_offset_size == LARGE) {
      pAVar3->initialize =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Initialize;
      pAVar3->append_vector =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Append;
      pcVar6 = ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Finalize;
    }
    else {
      pAVar3->initialize =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::Initialize;
      pAVar3->append_vector =
           ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::Append;
      pcVar6 = ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::Finalize;
    }
    break;
  case INTERVAL:
    pAVar3->initialize =
         ArrowScalarData<duckdb::ArrowInterval,_duckdb::interval_t,_duckdb::ArrowIntervalConverter>
         ::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<duckdb::ArrowInterval,_duckdb::interval_t,_duckdb::ArrowIntervalConverter>
         ::Append;
    pcVar6 = ArrowScalarData<duckdb::ArrowInterval,_duckdb::interval_t,_duckdb::ArrowIntervalConverter>
             ::Finalize;
    break;
  case UTINYINT:
    pAVar3->initialize =
         ArrowScalarData<unsigned_char,_unsigned_char,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<unsigned_char,_unsigned_char,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<unsigned_char,_unsigned_char,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case USMALLINT:
    pAVar3->initialize =
         ArrowScalarData<unsigned_short,_unsigned_short,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<unsigned_short,_unsigned_short,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<unsigned_short,_unsigned_short,_duckdb::ArrowScalarConverter>::Finalize
    ;
    break;
  case UINTEGER:
    pAVar3->initialize =
         ArrowScalarData<unsigned_int,_unsigned_int,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<unsigned_int,_unsigned_int,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<unsigned_int,_unsigned_int,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case UBIGINT:
    pAVar3->initialize =
         ArrowScalarData<unsigned_long,_unsigned_long,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<unsigned_long,_unsigned_long,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<unsigned_long,_unsigned_long,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case TIME_TZ:
    if ((pAVar3->options).arrow_lossless_conversion != true) {
      pAVar3->initialize =
           ArrowScalarData<long,_duckdb::dtime_tz_t,_duckdb::ArrowTimeTzConverter>::Initialize;
      pAVar3->append_vector =
           ArrowScalarBaseData<long,_duckdb::dtime_tz_t,_duckdb::ArrowTimeTzConverter>::Append;
      pcVar6 = ArrowScalarData<long,_duckdb::dtime_tz_t,_duckdb::ArrowTimeTzConverter>::Finalize;
      break;
    }
  case BIGINT:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case TIMESTAMP_TZ:
    pAVar3->initialize = ArrowScalarData<long,_long,_duckdb::ArrowScalarConverter>::Initialize;
    pAVar3->append_vector = ArrowScalarBaseData<long,_long,_duckdb::ArrowScalarConverter>::Append;
    pcVar6 = ArrowScalarData<long,_long,_duckdb::ArrowScalarConverter>::Finalize;
    break;
  case UHUGEINT:
    pAVar3->initialize =
         ArrowScalarData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
         Initialize;
    pAVar3->append_vector =
         ArrowScalarBaseData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
         Append;
    pcVar6 = ArrowScalarData<duckdb::uhugeint_t,_duckdb::uhugeint_t,_duckdb::ArrowScalarConverter>::
             Finalize;
    break;
  case UUID:
    if ((pAVar3->options).arrow_lossless_conversion == true) {
      pAVar3->initialize =
           ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowUUIDBlobConverter>::
           Initialize;
      pAVar3->append_vector =
           ArrowScalarBaseData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowUUIDBlobConverter>
           ::Append;
      pcVar6 = ArrowScalarData<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::ArrowUUIDBlobConverter>
               ::Finalize;
    }
    else if ((pAVar3->options).arrow_offset_size == LARGE) {
      pAVar3->initialize =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_long>::Initialize;
      pAVar3->append_vector =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_long>::Append;
      pcVar6 = ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_long>::Finalize;
    }
    else {
      pAVar3->initialize =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::Initialize;
      pAVar3->append_vector =
           ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::Append;
      pcVar6 = ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::Finalize;
    }
    break;
  default:
    switch(array_type.id_) {
    case STRUCT:
      pAVar3->initialize = ArrowStructData::Initialize;
      pAVar3->append_vector = ArrowStructData::Append;
      pcVar6 = ArrowStructData::Finalize;
      break;
    case LIST:
      AVar1 = (pAVar3->options).arrow_offset_size;
      if ((pAVar3->options).arrow_use_list_view == true) {
        if (AVar1 == LARGE) {
          pAVar3->initialize = ArrowListViewData<long>::Initialize;
          pAVar3->append_vector = ArrowListViewData<long>::Append;
          pcVar6 = ArrowListViewData<long>::Finalize;
        }
        else {
          pAVar3->initialize = ArrowListViewData<int>::Initialize;
          pAVar3->append_vector = ArrowListViewData<int>::Append;
          pcVar6 = ArrowListViewData<int>::Finalize;
        }
      }
      else if (AVar1 == LARGE) {
        pAVar3->initialize = ArrowListData<long>::Initialize;
        pAVar3->append_vector = ArrowListData<long>::Append;
        pcVar6 = ArrowListData<long>::Finalize;
      }
      else {
        pAVar3->initialize = ArrowListData<int>::Initialize;
        pAVar3->append_vector = ArrowListData<int>::Append;
        pcVar6 = ArrowListData<int>::Finalize;
      }
      break;
    case MAP:
      pAVar3->initialize = ArrowMapData<int>::Initialize;
      pAVar3->append_vector = ArrowMapData<int>::Append;
      pcVar6 = ArrowMapData<int>::Finalize;
      break;
    default:
      goto switchD_008b788f_caseD_2;
    case ENUM:
      if (array_type.physical_type_ == UINT32) {
        pAVar3->initialize = ArrowEnumData<int>::Initialize;
        pAVar3->append_vector = ArrowScalarBaseData<int,_int,_duckdb::ArrowScalarConverter>::Append;
        pcVar6 = ArrowEnumData<int>::Finalize;
      }
      else if (array_type.physical_type_ == UINT16) {
        pAVar3->initialize = ArrowEnumData<short>::Initialize;
        pAVar3->append_vector =
             ArrowScalarBaseData<short,_short,_duckdb::ArrowScalarConverter>::Append;
        pcVar6 = ArrowEnumData<short>::Finalize;
      }
      else {
        if (array_type.physical_type_ != UINT8) {
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_68,"Unsupported internal enum type",(allocator *)&local_48);
          InternalException::InternalException(pIVar5,&local_68);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pAVar3->initialize = ArrowEnumData<signed_char>::Initialize;
        pAVar3->append_vector =
             ArrowScalarBaseData<signed_char,_signed_char,_duckdb::ArrowScalarConverter>::Append;
        pcVar6 = ArrowEnumData<signed_char>::Finalize;
      }
      break;
    case UNION:
      pAVar3->initialize = ArrowUnionData::Initialize;
      pAVar3->append_vector = ArrowUnionData::Append;
      pcVar6 = ArrowUnionData::Finalize;
      break;
    case ARRAY:
      pAVar3->initialize = ArrowFixedSizeListData::Initialize;
      pAVar3->append_vector = ArrowFixedSizeListData::Append;
      pcVar6 = ArrowFixedSizeListData::Finalize;
    }
  }
  pAVar3->finalize = pcVar6;
  pAVar4 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)this);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator=
            (&pAVar4->extension_data,extension_type);
  pAVar4 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)this);
  this_01 = ArrowAppendData::GetValidityBuffer(pAVar4);
  ArrowBuffer::reserve(this_01,capacity + 7 >> 3);
  pAVar4 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator->((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)this);
  p_Var2 = pAVar4->initialize;
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                      *)this);
  (*p_Var2)(pAVar3,&array_type,capacity);
  LogicalType::~LogicalType(&array_type);
  return (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
         (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)this;
}

Assistant:

unique_ptr<ArrowAppendData> ArrowAppender::InitializeChild(const LogicalType &type, const idx_t capacity,
                                                           ClientProperties &options,
                                                           const shared_ptr<ArrowTypeExtensionData> &extension_type) {
	auto result = make_uniq<ArrowAppendData>(options);
	LogicalType array_type = type;
	if (extension_type) {
		array_type = extension_type->GetInternalType();
	}
	InitializeFunctionPointers(*result, array_type);
	result->extension_data = extension_type;

	const auto byte_count = (capacity + 7) / 8;
	result->GetValidityBuffer().reserve(byte_count);
	result->initialize(*result, array_type, capacity);
	return result;
}